

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O1

void tt_interpolate_deltas
               (FT_Outline *outline,FT_Vector *out_points,FT_Vector *in_points,FT_Bool *has_delta)

{
  int iVar1;
  FT_Pos *pFVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int p2;
  int p1;
  int ref2;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint ref2_00;
  long lVar11;
  
  if (outline->n_contours != 0) {
    lVar5 = 0;
    uVar7 = 0;
    do {
      p2 = (int)outline->contours[lVar5];
      p1 = (int)uVar7;
      uVar10 = uVar7;
      if (p1 <= p2) {
        lVar11 = (long)p2;
        lVar4 = (long)p1;
        lVar8 = 0;
        iVar1 = p1;
LAB_00173575:
        iVar1 = iVar1 + 1;
        if (has_delta[lVar8 + lVar4] == '\0') goto code_r0x0017357c;
        ref2 = (int)(uVar7 + lVar8);
        if (ref2 < p2) {
          lVar9 = (long)iVar1 + -1;
          uVar7 = uVar7 + lVar8 & 0xffffffff;
          do {
            if (has_delta[lVar9 + 1] != '\0') {
              ref2_00 = (int)lVar9 + 1;
              tt_delta_interpolate
                        ((int)uVar7 + 1,(int)lVar9,(int)uVar7,ref2_00,in_points,out_points);
              uVar7 = (ulong)ref2_00;
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < lVar11);
          uVar10 = (ulong)((int)lVar9 + 1);
          iVar1 = (int)uVar7;
        }
        else {
          uVar10 = uVar7 + lVar8 + 1;
          iVar1 = ref2;
        }
        if ((int)lVar8 + (p1 - iVar1) == 0) {
          lVar8 = (long)iVar1;
          if (out_points[lVar8].y != in_points[lVar8].y || out_points[lVar8].x != in_points[lVar8].x
             ) {
            lVar9 = out_points[lVar8].x - in_points[lVar8].x;
            lVar3 = out_points[lVar8].y - in_points[lVar8].y;
            if (p1 < iVar1) {
              lVar6 = lVar8 - lVar4;
              pFVar2 = &out_points[lVar4].y;
              do {
                ((FT_Vector *)(pFVar2 + -1))->x = ((FT_Vector *)(pFVar2 + -1))->x + lVar9;
                *pFVar2 = *pFVar2 + lVar3;
                pFVar2 = pFVar2 + 2;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
            }
            if (iVar1 < p2) {
              lVar11 = lVar11 - lVar8;
              pFVar2 = &out_points[lVar8 + 1].y;
              do {
                ((FT_Vector *)(pFVar2 + -1))->x = ((FT_Vector *)(pFVar2 + -1))->x + lVar9;
                *pFVar2 = *pFVar2 + lVar3;
                pFVar2 = pFVar2 + 2;
                lVar11 = lVar11 + -1;
              } while (lVar11 != 0);
            }
          }
        }
        else {
          tt_delta_interpolate(iVar1 + 1,p2,iVar1,ref2,in_points,out_points);
          if (0 < lVar4 + lVar8) {
            tt_delta_interpolate(p1,p1 + (int)lVar8 + -1,iVar1,ref2,in_points,out_points);
          }
        }
      }
LAB_00173715:
      lVar5 = lVar5 + 1;
      uVar7 = uVar10 & 0xffffffff;
    } while (lVar5 < outline->n_contours);
  }
  return;
code_r0x0017357c:
  lVar9 = lVar4 + lVar8;
  lVar8 = lVar8 + 1;
  uVar10 = (ulong)(p2 + 1);
  if (lVar11 <= lVar9) goto LAB_00173715;
  goto LAB_00173575;
}

Assistant:

static void
  tt_interpolate_deltas( FT_Outline*  outline,
                         FT_Vector*   out_points,
                         FT_Vector*   in_points,
                         FT_Bool*     has_delta )
  {
    FT_Int  first_point;
    FT_Int  end_point;

    FT_Int  first_delta;
    FT_Int  cur_delta;

    FT_Int    point;
    FT_Short  contour;


    /* ignore empty outlines */
    if ( !outline->n_contours )
      return;

    contour = 0;
    point   = 0;

    do
    {
      end_point   = outline->contours[contour];
      first_point = point;

      /* search first point that has a delta */
      while ( point <= end_point && !has_delta[point] )
        point++;

      if ( point <= end_point )
      {
        first_delta = point;
        cur_delta   = point;

        point++;

        while ( point <= end_point )
        {
          /* search next point that has a delta  */
          /* and interpolate intermediate points */
          if ( has_delta[point] )
          {
            tt_delta_interpolate( cur_delta + 1,
                                  point - 1,
                                  cur_delta,
                                  point,
                                  in_points,
                                  out_points );
            cur_delta = point;
          }

          point++;
        }

        /* shift contour if we only have a single delta */
        if ( cur_delta == first_delta )
          tt_delta_shift( first_point,
                          end_point,
                          cur_delta,
                          in_points,
                          out_points );
        else
        {
          /* otherwise handle remaining points       */
          /* at the end and beginning of the contour */
          tt_delta_interpolate( cur_delta + 1,
                                end_point,
                                cur_delta,
                                first_delta,
                                in_points,
                                out_points );

          if ( first_delta > 0 )
            tt_delta_interpolate( first_point,
                                  first_delta - 1,
                                  cur_delta,
                                  first_delta,
                                  in_points,
                                  out_points );
        }
      }
      contour++;

    } while ( contour < outline->n_contours );
  }